

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.cpp
# Opt level: O1

void __thiscall SpeechBubble::drawSelf(SpeechBubble *this,PixelGameEngine *pge)

{
  size_type sVar1;
  Decal *pDVar2;
  double dVar3;
  vf2d local_88;
  vf2d local_80;
  vf2d local_78;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  double local_50;
  undefined1 local_48 [16];
  
  local_70._0_4_ = (undefined4)(this->position).x;
  local_70._4_4_ = (undefined4)(this->position).y;
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 0.0;
  local_80.y = 0.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.x = 1.0;
  local_78.y = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->position).x + (this->scale).x + -0x10);
  local_70._4_4_ = (undefined4)(this->position).y;
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 32.0;
  local_80.y = 0.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.x = 1.0;
  local_78.y = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)(this->position).x;
  local_70._4_4_ = (undefined4)((this->scale).y + -0x10 + (this->position).y);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 0.0;
  local_80.y = 32.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.x = 1.0;
  local_78.y = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->position).x + -0x10 + (this->scale).x);
  local_70._4_4_ = (undefined4)((this->position).y + -0x10 + (this->scale).y);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 32.0;
  local_80.y = 32.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.x = 1.0;
  local_78.y = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->position).x + 0x10);
  local_70._4_4_ = (undefined4)(this->position).y;
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 16.0;
  local_80.y = 0.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.y = 1.0;
  local_78.x = (float)((this->scale).x + -0x20) * 0.0625;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->position).x + 0x10);
  local_70._4_4_ = (undefined4)((this->scale).y + (this->position).y + -0x10);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 16.0;
  local_80.y = 32.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.y = 1.0;
  local_78.x = (float)((this->scale).x + -0x20) * 0.0625;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)(this->position).x;
  local_70._4_4_ = (undefined4)((this->position).y + 0x10);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 0.0;
  local_80.y = 16.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.y = (float)((this->scale).y + -0x20) * 0.0625;
  local_78.x = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->scale).x + (this->position).x + -0x10);
  local_70._4_4_ = (undefined4)((this->position).y + 0x10);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 32.0;
  local_80.y = 16.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.y = (float)((this->scale).y + -0x20) * 0.0625;
  local_78.x = 1.0;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_70._0_4_ = (undefined4)((this->position).x + 0x10);
  local_70._4_4_ = (undefined4)((this->position).y + 0x10);
  pDVar2 = olc::Renderable::Decal
                     ((this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  local_80.x = 16.0;
  local_80.y = 16.0;
  local_88.x = 16.0;
  local_88.y = 16.0;
  local_78.y = (float)((this->scale).y + -0x20) * 0.0625;
  local_78.x = (float)((this->scale).x + -0x20) * 0.0625;
  olc::PixelGameEngine::DrawPartialDecal
            (pge,(vf2d *)local_70,pDVar2,&local_80,&local_88,&local_78,(Pixel *)&olc::WHITE);
  local_80.y = (float)((this->position).y + 6);
  local_80.x = (float)((this->position).x + 6);
  sVar1 = (this->curText)._M_string_length;
  dVar3 = (double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25;
  local_48._8_4_ = SUB84(dVar3,0);
  local_48._0_8_ = dVar3 + ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  local_48._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_50 = (double)this->timeElapsed;
  SoLoud::Wav::getLength(&this->soundSample);
  std::__cxx11::string::substr((ulong)local_70,(ulong)this);
  local_88.x = 1.0;
  local_88.y = 1.0;
  olc::PixelGameEngine::DrawStringDecal
            (pge,&local_80,(string *)local_70,(Pixel)olc::WHITE.field_1,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_70._4_4_,local_70._0_4_) != &local_60) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_70._4_4_,local_70._0_4_),local_60._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SpeechBubble::drawSelf(olc::PixelGameEngine *pge) {
    //Draw Background
    pge->DrawPartialDecal(position,
	    sprite->Decal(), {0, 0}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{scale.x - 16, 0},
	    sprite->Decal(), {32, 0}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{0, scale.y - 16},
	    sprite->Decal(), {0, 32}, {16, 16});
    pge->DrawPartialDecal(position + scale - olc::vi2d{16, 16},
	    sprite->Decal(), {32, 32}, {16, 16});
    pge->DrawPartialDecal(position + olc::vi2d{16, 0},
	    sprite->Decal(), {16, 0}, {16, 16},
	    {(scale.x - 32) / 16.0f, 1});
    pge->DrawPartialDecal(position + olc::vi2d{16, scale.y - 16},
	    sprite->Decal(), {16, 32}, {16, 16},
	    {(scale.x - 32) / 16.0f, 1});
    pge->DrawPartialDecal(position + olc::vi2d{0, 16},
	    sprite->Decal(), {0, 16}, {16, 16},
	    {1, (scale.y - 32) / 16.0f});
    pge->DrawPartialDecal(position + olc::vi2d{scale.x - 16, 16},
	    sprite->Decal(), {32, 16}, {16, 16},
	    {1, (scale.y - 32) / 16.0f});
    pge->DrawPartialDecal(position + olc::vi2d{16, 16},
	    sprite->Decal(), {16, 16}, {16, 16},
	    {(scale.x - 32) / 16.0f, (scale.y - 32) / 16.0f});

    pge->DrawStringDecal(position + olc::vi2d{6, 6},
	    curText.substr(0, int(curText.size() * (timeElapsed / soundSample.getLength())))
	    );
}